

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_cost_enc.c
# Opt level: O3

void PushInterval(CostManager *manager,double distance_cost,int position,int len)

{
  int iVar1;
  int end;
  float *pfVar2;
  CostCacheInterval *pCVar3;
  CostInterval *pCVar4;
  CostInterval *pCVar5;
  CostCacheInterval *pCVar6;
  bool bVar7;
  long lVar8;
  CostManager *pCVar9;
  long lVar10;
  ulong uVar11;
  CostInterval *interval_in;
  int start_new;
  int iVar12;
  int iVar13;
  float fVar14;
  
  if (len < 10) {
    if (0 < len) {
      pfVar2 = manager->costs_;
      lVar8 = (long)position;
      lVar10 = 4;
      do {
        fVar14 = (float)(manager->cost_cache_[lVar10 + -4] + distance_cost);
        if (fVar14 < pfVar2[lVar8]) {
          pfVar2[lVar8] = fVar14;
          manager->dist_array_[lVar8] = (short)lVar10 - 3;
        }
        lVar8 = lVar8 + 1;
        lVar10 = lVar10 + 1;
      } while (lVar8 < len + position);
    }
  }
  else if (manager->cache_intervals_size_ != 0) {
    pCVar3 = manager->cache_intervals_;
    interval_in = manager->head_;
    uVar11 = 0;
    do {
      iVar1 = pCVar3[uVar11].start_;
      if (len <= iVar1) {
        return;
      }
      pCVar6 = pCVar3 + uVar11;
      iVar13 = pCVar6->end_;
      if (len <= iVar13) {
        iVar13 = len;
      }
      iVar13 = iVar13 + position;
      fVar14 = (float)(pCVar6->cost_ + distance_cost);
      iVar1 = iVar1 + position;
      pCVar4 = interval_in;
      do {
        while( true ) {
          while( true ) {
            do {
              interval_in = pCVar4;
              iVar12 = iVar1;
              if (interval_in == (CostInterval *)0x0) {
                interval_in = (CostInterval *)0x0;
                goto LAB_0014f6aa;
              }
              end = interval_in->start_;
              if (iVar13 <= end) goto LAB_0014f6aa;
              pCVar4 = interval_in->next_;
              iVar12 = interval_in->end_;
            } while (iVar12 <= iVar1);
            if (fVar14 < interval_in->cost_) break;
            InsertInterval(manager,interval_in,fVar14,position,iVar1,end);
            iVar1 = iVar12;
            if (iVar13 <= iVar12) goto LAB_0014f6aa;
          }
          if (end < iVar1) break;
          if (iVar13 < iVar12) {
            interval_in->start_ = iVar13;
            iVar12 = iVar1;
            goto LAB_0014f6aa;
          }
          pCVar5 = interval_in->previous_;
          pCVar9 = (CostManager *)&pCVar5->next_;
          if (pCVar5 == (CostInterval *)0x0) {
            pCVar9 = manager;
          }
          pCVar9->head_ = pCVar4;
          if (pCVar4 != (CostInterval *)0x0) {
            pCVar4->previous_ = pCVar5;
          }
          bVar7 = manager->intervals_ + 9 < interval_in || interval_in < manager->intervals_;
          pCVar5 = (&manager->free_intervals_)[bVar7];
          (&manager->free_intervals_)[bVar7] = interval_in;
          interval_in->next_ = pCVar5;
          manager->count_ = manager->count_ + -1;
        }
        interval_in->end_ = iVar1;
      } while (iVar12 <= iVar13);
      InsertInterval(manager,interval_in,interval_in->cost_,interval_in->index_,iVar13,iVar12);
      interval_in = interval_in->next_;
      iVar12 = iVar1;
LAB_0014f6aa:
      InsertInterval(manager,interval_in,fVar14,position,iVar12,iVar13);
      uVar11 = uVar11 + 1;
    } while (uVar11 < manager->cache_intervals_size_);
  }
  return;
}

Assistant:

static WEBP_INLINE void PushInterval(CostManager* const manager,
                                     double distance_cost, int position,
                                     int len) {
  size_t i;
  CostInterval* interval = manager->head_;
  CostInterval* interval_next;
  const CostCacheInterval* const cost_cache_intervals =
      manager->cache_intervals_;
  // If the interval is small enough, no need to deal with the heavy
  // interval logic, just serialize it right away. This constant is empirical.
  const int kSkipDistance = 10;

  if (len < kSkipDistance) {
    int j;
    for (j = position; j < position + len; ++j) {
      const int k = j - position;
      float cost_tmp;
      assert(k >= 0 && k < MAX_LENGTH);
      cost_tmp = (float)(distance_cost + manager->cost_cache_[k]);

      if (manager->costs_[j] > cost_tmp) {
        manager->costs_[j] = cost_tmp;
        manager->dist_array_[j] = k + 1;
      }
    }
    return;
  }

  for (i = 0; i < manager->cache_intervals_size_ &&
              cost_cache_intervals[i].start_ < len;
       ++i) {
    // Define the intersection of the ith interval with the new one.
    int start = position + cost_cache_intervals[i].start_;
    const int end = position + (cost_cache_intervals[i].end_ > len
                                 ? len
                                 : cost_cache_intervals[i].end_);
    const float cost = (float)(distance_cost + cost_cache_intervals[i].cost_);

    for (; interval != NULL && interval->start_ < end;
         interval = interval_next) {
      interval_next = interval->next_;

      // Make sure we have some overlap
      if (start >= interval->end_) continue;

      if (cost >= interval->cost_) {
        // When intervals are represented, the lower, the better.
        // [**********************************************************[
        // start                                                    end
        //                   [----------------------------------[
        //                   interval->start_       interval->end_
        // If we are worse than what we already have, add whatever we have so
        // far up to interval.
        const int start_new = interval->end_;
        InsertInterval(manager, interval, cost, position, start,
                       interval->start_);
        start = start_new;
        if (start >= end) break;
        continue;
      }

      if (start <= interval->start_) {
        if (interval->end_ <= end) {
          //                   [----------------------------------[
          //                   interval->start_       interval->end_
          // [**************************************************************[
          // start                                                        end
          // We can safely remove the old interval as it is fully included.
          PopInterval(manager, interval);
        } else {
          //              [------------------------------------[
          //              interval->start_        interval->end_
          // [*****************************[
          // start                       end
          interval->start_ = end;
          break;
        }
      } else {
        if (end < interval->end_) {
          // [--------------------------------------------------------------[
          // interval->start_                                  interval->end_
          //                     [*****************************[
          //                     start                       end
          // We have to split the old interval as it fully contains the new one.
          const int end_original = interval->end_;
          interval->end_ = start;
          InsertInterval(manager, interval, interval->cost_, interval->index_,
                         end, end_original);
          interval = interval->next_;
          break;
        } else {
          // [------------------------------------[
          // interval->start_        interval->end_
          //                     [*****************************[
          //                     start                       end
          interval->end_ = start;
        }
      }
    }
    // Insert the remaining interval from start to end.
    InsertInterval(manager, interval, cost, position, start, end);
  }
}